

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool __thiscall ImGuiListClipper::Step(ImGuiListClipper *this)

{
  long lVar1;
  int *piVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  ImGuiWindow *window;
  void *pvVar8;
  ImGuiTable *table;
  long lVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  bool bVar12;
  undefined1 auVar13 [12];
  ImGuiContext *pIVar14;
  uint uVar15;
  int iVar16;
  bool *pbVar17;
  int iVar18;
  long lVar19;
  int iVar20;
  ulong uVar21;
  long lVar22;
  long lVar23;
  ImGuiListClipperRange *pIVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  ImRect IVar28;
  ImGuiListClipperRange local_40;
  
  pIVar14 = GImGui;
  window = GImGui->CurrentWindow;
  pvVar8 = this->TempData;
  table = GImGui->CurrentTable;
  if ((table != (ImGuiTable *)0x0) && (table->IsInsideRow == true)) {
    ImGui::TableEndRow(table);
  }
  iVar20 = this->ItemsCount;
  if (iVar20 == 0) goto LAB_00108b84;
  if (GImGui->CurrentTable == (ImGuiTable *)0x0) {
    pbVar17 = &GImGui->CurrentWindow->SkipItems;
  }
  else {
    pbVar17 = &GImGui->CurrentTable->HostSkipItems;
  }
  if (*pbVar17 == true) goto LAB_00108b84;
  iVar27 = *(int *)((long)pvVar8 + 0xc);
  if (iVar27 == 0 && table != (ImGuiTable *)0x0) {
    if (table->IsUnfrozenRows == false) {
      iVar27 = *(int *)((long)pvVar8 + 0x10);
      this->DisplayStart = iVar27;
      this->DisplayEnd = iVar27 + 1;
      if (iVar27 < iVar20) {
        *(int *)((long)pvVar8 + 0x10) = iVar27 + 1;
        return true;
      }
      goto LAB_00108b84;
    }
LAB_00108bf8:
    this->StartPosY = (window->DC).CursorPos.y;
    if (this->ItemsHeight <= 0.0) {
      local_40.Max = *(int *)((long)pvVar8 + 0x10) + 1;
      local_40.Min = *(int *)((long)pvVar8 + 0x10);
      local_40.PosToIndexConvert = false;
      local_40.PosToIndexOffsetMin = '\0';
      local_40.PosToIndexOffsetMax = '\0';
      local_40._11_1_ = 0;
      ImVector<ImGuiListClipperRange>::push_front
                ((ImVector<ImGuiListClipperRange> *)((long)pvVar8 + 0x18),&local_40);
      piVar2 = *(int **)((long)pvVar8 + 0x20);
      iVar20 = *piVar2;
      iVar27 = *(int *)((long)pvVar8 + 0x10);
      if (*(int *)((long)pvVar8 + 0x10) < iVar20) {
        iVar27 = iVar20;
      }
      this->DisplayStart = iVar27;
      iVar20 = piVar2[1];
      iVar18 = this->ItemsCount;
      if (iVar20 < this->ItemsCount) {
        iVar18 = iVar20;
      }
      this->DisplayEnd = iVar18;
      if (iVar27 != iVar18) {
        *(undefined4 *)((long)pvVar8 + 0xc) = 1;
        return true;
      }
      goto LAB_00108b84;
    }
    iVar18 = this->DisplayEnd;
    if (iVar27 == 0) goto LAB_00108cf1;
LAB_00108c24:
    uVar15 = *(uint *)((long)pvVar8 + 0x18);
  }
  else {
    if (iVar27 == 0) goto LAB_00108bf8;
    if (0.0 < this->ItemsHeight) {
      iVar18 = this->DisplayEnd;
      goto LAB_00108c24;
    }
    fVar3 = (window->DC).CursorPos.y;
    iVar18 = this->DisplayEnd;
    this->ItemsHeight = (fVar3 - this->StartPosY) / (float)(iVar18 - this->DisplayStart);
    if ((16777216.0 <= ABS(this->StartPosY)) || (16777216.0 <= ABS(fVar3))) {
      this->ItemsHeight = (window->DC).PrevLineSize.y + (pIVar14->Style).ItemSpacing.y;
    }
LAB_00108cf1:
    if (pIVar14->LogEnabled == true) {
      auVar13[4] = local_40.PosToIndexConvert;
      auVar13[5] = local_40.PosToIndexOffsetMin;
      auVar13[6] = local_40.PosToIndexOffsetMax;
      auVar13[7] = local_40._11_1_;
      auVar13._0_4_ = iVar20;
      auVar13._8_4_ = 0;
      local_40 = (ImGuiListClipperRange)(auVar13 << 0x20);
      local_40.PosToIndexConvert = false;
      local_40.PosToIndexOffsetMin = '\0';
      local_40.PosToIndexOffsetMax = '\0';
      local_40._11_1_ = 0;
      ImVector<ImGuiListClipperRange>::push_back
                ((ImVector<ImGuiListClipperRange> *)((long)pvVar8 + 0x18),&local_40);
    }
    else {
      if (((pIVar14->NavMoveScoringItems == true) && (pIVar14->NavWindow != (ImGuiWindow *)0x0)) &&
         (pIVar14->NavWindow->RootWindowForNav == window->RootWindowForNav)) {
        local_40.Max = (int)(pIVar14->NavScoringNoClipRect).Max.y;
        local_40.Min = (int)(pIVar14->NavScoringNoClipRect).Min.y;
        local_40.PosToIndexConvert = true;
        local_40.PosToIndexOffsetMin = '\0';
        local_40.PosToIndexOffsetMax = '\0';
        local_40._11_1_ = 0;
        ImVector<ImGuiListClipperRange>::push_back
                  ((ImVector<ImGuiListClipperRange> *)((long)pvVar8 + 0x18),&local_40);
        bVar12 = true;
        if (((pIVar14->NavMoveFlags & 0x400) != 0) && (pIVar14->NavTabbingDir == -1)) {
          local_40.Max = this->ItemsCount;
          local_40.Min = this->ItemsCount + -1;
          local_40.PosToIndexConvert = false;
          local_40.PosToIndexOffsetMin = '\0';
          local_40.PosToIndexOffsetMax = '\0';
          local_40._11_1_ = 0;
          ImVector<ImGuiListClipperRange>::push_back
                    ((ImVector<ImGuiListClipperRange> *)((long)pvVar8 + 0x18),&local_40);
        }
      }
      else {
        bVar12 = false;
      }
      IVar28 = ImGui::WindowRectRelToAbs(window,window->NavRectRel);
      if ((pIVar14->NavId != 0) && (window->NavLastIds[0] == pIVar14->NavId)) {
        local_40.Max = (int)IVar28.Max.y;
        local_40.Min = (int)IVar28.Min.y;
        local_40.PosToIndexConvert = true;
        local_40.PosToIndexOffsetMin = '\0';
        local_40.PosToIndexOffsetMax = '\0';
        local_40._11_1_ = 0;
        ImVector<ImGuiListClipperRange>::push_back
                  ((ImVector<ImGuiListClipperRange> *)((long)pvVar8 + 0x18),&local_40);
      }
      iVar20 = 0;
      uVar15 = 0;
      if (bVar12) {
        iVar20 = -(uint)(pIVar14->NavMoveClipDir == 2);
        uVar15 = (uint)(pIVar14->NavMoveClipDir == 3);
      }
      local_40 = ImGuiListClipperRange::FromPositions
                           ((window->ClipRect).Min.y,(window->ClipRect).Max.y,iVar20,uVar15);
      ImVector<ImGuiListClipperRange>::push_back
                ((ImVector<ImGuiListClipperRange> *)((long)pvVar8 + 0x18),&local_40);
    }
    uVar15 = *(uint *)((long)pvVar8 + 0x18);
    fVar3 = this->ItemsHeight;
    iVar20 = this->ItemsCount;
    lVar19 = 0;
    uVar21 = 0;
    if (0 < (int)uVar15) {
      uVar21 = (ulong)uVar15;
    }
    for (; uVar21 * 0xc - lVar19 != 0; lVar19 = lVar19 + 0xc) {
      lVar22 = *(long *)((long)pvVar8 + 0x20);
      if (*(char *)(lVar22 + 8 + lVar19) == '\x01') {
        fVar4 = (window->DC).CursorPos.y;
        fVar5 = *(float *)((long)pvVar8 + 8);
        iVar25 = *(char *)(lVar22 + 9 + lVar19) + iVar18 +
                 (int)((((float)*(int *)(lVar22 + lVar19) - fVar4) - fVar5) / fVar3);
        iVar27 = iVar20 + -1;
        if (iVar25 < iVar20 + -1) {
          iVar27 = iVar25;
        }
        if (iVar25 < iVar18) {
          iVar27 = iVar18;
        }
        *(int *)(lVar22 + lVar19) = iVar27;
        iVar26 = *(char *)(lVar22 + 10 + lVar19) + iVar18 +
                 (int)((((float)*(int *)(lVar22 + 4 + lVar19) - fVar4) - fVar5) / fVar3 + 0.999999);
        iVar25 = iVar20;
        if (iVar26 < iVar20) {
          iVar25 = iVar26;
        }
        if (iVar26 <= iVar27) {
          iVar25 = iVar27 + 1;
        }
        *(int *)(lVar22 + 4 + lVar19) = iVar25;
        *(undefined1 *)(lVar22 + 8 + lVar19) = 0;
      }
    }
    iVar27 = *(int *)((long)pvVar8 + 0xc);
    if (1 < (int)(uVar15 - iVar27)) {
      lVar19 = (long)iVar27;
      uVar21 = (ulong)(uVar15 - iVar27);
      while (1 < (long)uVar21) {
        uVar21 = uVar21 - 1;
        lVar22 = lVar19 * 0xc;
        for (lVar23 = lVar19; lVar23 < (long)(uVar21 + lVar19); lVar23 = lVar23 + 1) {
          lVar9 = *(long *)((long)pvVar8 + 0x20);
          if (*(int *)(lVar9 + 0xc + lVar22) < *(int *)(lVar9 + lVar22)) {
            lVar1 = lVar9 + lVar22;
            pIVar24 = (ImGuiListClipperRange *)(lVar9 + lVar22);
            uVar6 = *(undefined4 *)&pIVar24->PosToIndexConvert;
            uVar10 = *(undefined8 *)pIVar24;
            local_40 = *pIVar24;
            uVar7 = *(undefined4 *)(lVar1 + 0x14);
            pIVar24->PosToIndexConvert = (bool)(char)uVar7;
            pIVar24->PosToIndexOffsetMin = (char)((uint)uVar7 >> 8);
            pIVar24->PosToIndexOffsetMax = (char)((uint)uVar7 >> 0x10);
            pIVar24->field_0xb = (char)((uint)uVar7 >> 0x18);
            uVar11 = *(undefined8 *)(lVar1 + 0xc);
            pIVar24->Min = (int)uVar11;
            pIVar24->Max = (int)((ulong)uVar11 >> 0x20);
            *(undefined4 *)(lVar1 + 0x14) = uVar6;
            *(undefined8 *)(lVar1 + 0xc) = uVar10;
          }
          lVar22 = lVar22 + 0xc;
        }
      }
      do {
        lVar19 = (long)iVar27;
        iVar27 = iVar27 + 1;
        while( true ) {
          uVar15 = ((ImVector<ImGuiListClipperRange> *)((long)pvVar8 + 0x18))->Size;
          if ((int)uVar15 <= iVar27) {
            iVar27 = *(int *)((long)pvVar8 + 0xc);
            goto LAB_00108fc5;
          }
          lVar22 = *(long *)((long)pvVar8 + 0x20);
          piVar2 = (int *)(lVar22 + lVar19 * 0xc);
          iVar20 = *(int *)(lVar22 + 4 + lVar19 * 0xc);
          iVar25 = *(int *)(lVar22 + (long)iVar27 * 0xc);
          pIVar24 = (ImGuiListClipperRange *)(lVar22 + (long)iVar27 * 0xc);
          if (iVar20 < iVar25) break;
          if (*piVar2 < iVar25) {
            iVar25 = *piVar2;
          }
          *piVar2 = iVar25;
          iVar25 = pIVar24->Max;
          if (iVar25 < iVar20) {
            iVar25 = iVar20;
          }
          piVar2[1] = iVar25;
          ImVector<ImGuiListClipperRange>::erase
                    ((ImVector<ImGuiListClipperRange> *)((long)pvVar8 + 0x18),pIVar24);
        }
      } while( true );
    }
  }
LAB_00108fc5:
  if (iVar27 < (int)uVar15) {
    lVar19 = *(long *)((long)pvVar8 + 0x20);
    iVar20 = *(int *)(lVar19 + (long)iVar27 * 0xc);
    iVar25 = iVar18;
    if (iVar18 < iVar20) {
      iVar25 = iVar20;
    }
    this->DisplayStart = iVar25;
    iVar26 = *(int *)(lVar19 + 4 + (long)iVar27 * 0xc);
    iVar16 = this->ItemsCount;
    if (iVar26 < this->ItemsCount) {
      iVar16 = iVar26;
    }
    this->DisplayEnd = iVar16;
    if (iVar18 < iVar20) {
      ImGuiListClipper_SeekCursorForItem(this,iVar25);
      iVar27 = *(int *)((long)pvVar8 + 0xc);
    }
    *(int *)((long)pvVar8 + 0xc) = iVar27 + 1;
    return true;
  }
  if (this->ItemsCount != 0x7fffffff) {
    ImGuiListClipper_SeekCursorForItem(this,this->ItemsCount);
  }
LAB_00108b84:
  End(this);
  return false;
}

Assistant:

bool ImGuiListClipper::Step()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiListClipperData* data = (ImGuiListClipperData*)TempData;
    IM_ASSERT(data != NULL && "Called ImGuiListClipper::Step() too many times, or before ImGuiListClipper::Begin() ?");

    ImGuiTable* table = g.CurrentTable;
    if (table && table->IsInsideRow)
        ImGui::TableEndRow(table);

    // No items
    if (ItemsCount == 0 || GetSkipItemForListClipping())
        return (void)End(), false;

    // While we are in frozen row state, keep displaying items one by one, unclipped
    // FIXME: Could be stored as a table-agnostic state.
    if (data->StepNo == 0 && table != NULL && !table->IsUnfrozenRows)
    {
        DisplayStart = data->ItemsFrozen;
        DisplayEnd = data->ItemsFrozen + 1;
        if (DisplayStart >= ItemsCount)
            return (void)End(), false;
        data->ItemsFrozen++;
        return true;
    }

    // Step 0: Let you process the first element (regardless of it being visible or not, so we can measure the element height)
    bool calc_clipping = false;
    if (data->StepNo == 0)
    {
        StartPosY = window->DC.CursorPos.y;
        if (ItemsHeight <= 0.0f)
        {
            // Submit the first item (or range) so we can measure its height (generally the first range is 0..1)
            data->Ranges.push_front(ImGuiListClipperRange::FromIndices(data->ItemsFrozen, data->ItemsFrozen + 1));
            DisplayStart = ImMax(data->Ranges[0].Min, data->ItemsFrozen);
            DisplayEnd = ImMin(data->Ranges[0].Max, ItemsCount);
            if (DisplayStart == DisplayEnd)
                return (void)End(), false;
            data->StepNo = 1;
            return true;
        }
        calc_clipping = true;   // If on the first step with known item height, calculate clipping.
    }

    // Step 1: Let the clipper infer height from first range
    if (ItemsHeight <= 0.0f)
    {
        IM_ASSERT(data->StepNo == 1);
        if (table)
            IM_ASSERT(table->RowPosY1 == StartPosY && table->RowPosY2 == window->DC.CursorPos.y);

        ItemsHeight = (window->DC.CursorPos.y - StartPosY) / (float)(DisplayEnd - DisplayStart);
        bool affected_by_floating_point_precision = ImIsFloatAboveGuaranteedIntegerPrecision(StartPosY) || ImIsFloatAboveGuaranteedIntegerPrecision(window->DC.CursorPos.y);
        if (affected_by_floating_point_precision)
            ItemsHeight = window->DC.PrevLineSize.y + g.Style.ItemSpacing.y; // FIXME: Technically wouldn't allow multi-line entries.

        IM_ASSERT(ItemsHeight > 0.0f && "Unable to calculate item height! First item hasn't moved the cursor vertically!");
        calc_clipping = true;   // If item height had to be calculated, calculate clipping afterwards.
    }

    // Step 0 or 1: Calculate the actual ranges of visible elements.
    const int already_submitted = DisplayEnd;
    if (calc_clipping)
    {
        if (g.LogEnabled)
        {
            // If logging is active, do not perform any clipping
            data->Ranges.push_back(ImGuiListClipperRange::FromIndices(0, ItemsCount));
        }
        else
        {
            // Add range selected to be included for navigation
            const bool is_nav_request = (g.NavMoveScoringItems && g.NavWindow && g.NavWindow->RootWindowForNav == window->RootWindowForNav);
            if (is_nav_request)
                data->Ranges.push_back(ImGuiListClipperRange::FromPositions(g.NavScoringNoClipRect.Min.y, g.NavScoringNoClipRect.Max.y, 0, 0));
            if (is_nav_request && (g.NavMoveFlags & ImGuiNavMoveFlags_Tabbing) && g.NavTabbingDir == -1)
                data->Ranges.push_back(ImGuiListClipperRange::FromIndices(ItemsCount - 1, ItemsCount));

            // Add focused/active item
            ImRect nav_rect_abs = ImGui::WindowRectRelToAbs(window, window->NavRectRel[0]);
            if (g.NavId != 0 && window->NavLastIds[0] == g.NavId)
                data->Ranges.push_back(ImGuiListClipperRange::FromPositions(nav_rect_abs.Min.y, nav_rect_abs.Max.y, 0, 0));

            // Add visible range
            const int off_min = (is_nav_request && g.NavMoveClipDir == ImGuiDir_Up) ? -1 : 0;
            const int off_max = (is_nav_request && g.NavMoveClipDir == ImGuiDir_Down) ? 1 : 0;
            data->Ranges.push_back(ImGuiListClipperRange::FromPositions(window->ClipRect.Min.y, window->ClipRect.Max.y, off_min, off_max));
        }

        // Convert position ranges to item index ranges
        // - Very important: when a starting position is after our maximum item, we set Min to (ItemsCount - 1). This allows us to handle most forms of wrapping.
        // - Due to how Selectable extra padding they tend to be "unaligned" with exact unit in the item list,
        //   which with the flooring/ceiling tend to lead to 2 items instead of one being submitted.
        for (int i = 0; i < data->Ranges.Size; i++)
            if (data->Ranges[i].PosToIndexConvert)
            {
                int m1 = (int)(((double)data->Ranges[i].Min - window->DC.CursorPos.y - data->LossynessOffset) / ItemsHeight);
                int m2 = (int)((((double)data->Ranges[i].Max - window->DC.CursorPos.y - data->LossynessOffset) / ItemsHeight) + 0.999999f);
                data->Ranges[i].Min = ImClamp(already_submitted + m1 + data->Ranges[i].PosToIndexOffsetMin, already_submitted, ItemsCount - 1);
                data->Ranges[i].Max = ImClamp(already_submitted + m2 + data->Ranges[i].PosToIndexOffsetMax, data->Ranges[i].Min + 1, ItemsCount);
                data->Ranges[i].PosToIndexConvert = false;
            }
        ImGuiListClipper_SortAndFuseRanges(data->Ranges, data->StepNo);
    }

    // Step 0+ (if item height is given in advance) or 1+: Display the next range in line.
    if (data->StepNo < data->Ranges.Size)
    {
        DisplayStart = ImMax(data->Ranges[data->StepNo].Min, already_submitted);
        DisplayEnd = ImMin(data->Ranges[data->StepNo].Max, ItemsCount);
        if (DisplayStart > already_submitted) //-V1051
            ImGuiListClipper_SeekCursorForItem(this, DisplayStart);
        data->StepNo++;
        return true;
    }

    // After the last step: Let the clipper validate that we have reached the expected Y position (corresponding to element DisplayEnd),
    // Advance the cursor to the end of the list and then returns 'false' to end the loop.
    if (ItemsCount < INT_MAX)
        ImGuiListClipper_SeekCursorForItem(this, ItemsCount);

    End();
    return false;
}